

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell.cc
# Opt level: O2

S1ChordAngle EdgeDistance(double dirIJ,double uv)

{
  double dVar1;
  S1ChordAngle SVar2;
  double dVar3;
  
  dVar3 = (dirIJ * dirIJ) / (uv * uv + 1.0);
  dVar1 = 1.0 - dVar3;
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  SVar2 = S1ChordAngle::FromLength2(dVar3 + (1.0 - dVar1) * (1.0 - dVar1));
  return (S1ChordAngle)SVar2.length2_;
}

Assistant:

inline static S1ChordAngle EdgeDistance(double dirIJ, double uv) {
  // Let P by the target point and let R be the closest point on the given
  // edge AB.  The desired distance PR can be expressed as PR^2 = PQ^2 + QR^2
  // where Q is the point P projected onto the plane through the great circle
  // through AB.  We can compute the distance PQ^2 perpendicular to the plane
  // from "dirIJ" (the dot product of the target point P with the edge
  // normal) and the squared length the edge normal (1 + uv**2).
  double pq2 = (dirIJ * dirIJ) / (1 + uv * uv);

  // We can compute the distance QR as (1 - OQ) where O is the sphere origin,
  // and we can compute OQ^2 = 1 - PQ^2 using the Pythagorean theorem.
  // (This calculation loses accuracy as angle POQ approaches Pi/2.)
  double qr = 1 - sqrt(1 - pq2);
  return S1ChordAngle::FromLength2(pq2 + qr * qr);
}